

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

void replay_hash(ResourceTag tag,Hash hash,DatabaseInterface *db_iface,StateReplayer *replayer,
                StateCreatorInterface *iface,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *iface_00;
  StateCreatorInterface *this;
  StateReplayer *pSVar1;
  DatabaseInterface *pDVar2;
  ResourceTag RVar3;
  bool bVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  size_type size;
  size_type local_40;
  size_t state_json_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json_local;
  StateCreatorInterface *iface_local;
  StateReplayer *replayer_local;
  DatabaseInterface *db_iface_local;
  Hash hash_local;
  ResourceTag tag_local;
  
  state_json_size = (size_t)state_json;
  state_json_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)iface;
  iface_local = (StateCreatorInterface *)replayer;
  replayer_local = (StateReplayer *)db_iface;
  db_iface_local = (DatabaseInterface *)hash;
  hash_local._4_4_ = tag;
  uVar5 = (*db_iface->_vptr_DatabaseInterface[3])(db_iface,(ulong)tag,hash,&local_40,0,0);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
    fflush(_stderr);
    exit(1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)state_json_size,local_40);
  RVar3 = hash_local._4_4_;
  pDVar2 = db_iface_local;
  pSVar1 = replayer_local;
  puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)state_json_size);
  uVar7 = (*(code *)(pSVar1->impl->replayed_samplers)._M_h._M_before_begin._M_nxt)
                    (pSVar1,RVar3,pDVar2,&local_40,puVar6,0);
  pSVar1 = replayer_local;
  this = iface_local;
  iface_00 = state_json_local;
  if ((uVar7 & 1) == 0) {
    fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
    fflush(_stderr);
    exit(1);
  }
  puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)state_json_size);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)state_json_size);
  bVar4 = Fossilize::StateReplayer::parse
                    ((StateReplayer *)this,(StateCreatorInterface *)iface_00,
                     (DatabaseInterface *)pSVar1,puVar6,size);
  if (!bVar4) {
    fprintf(_stderr,"Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%016lx).\n",
            (ulong)hash_local._4_4_,db_iface_local);
    fflush(_stderr);
  }
  return;
}

Assistant:

static void replay_hash(ResourceTag tag, Hash hash, DatabaseInterface &db_iface,
                        StateReplayer &replayer, StateCreatorInterface &iface,
                        vector<uint8_t> &state_json)
{
	size_t state_json_size;
	if (!db_iface.read_entry(tag, hash, &state_json_size, nullptr, 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	state_json.resize(state_json_size);

	if (!db_iface.read_entry(tag, hash, &state_json_size, state_json.data(), 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	if (!replayer.parse(iface, &db_iface, state_json.data(), state_json.size()))
		LOGE("Failed to parse blob (tag: %d, hash: 0x%016" PRIx64 ").\n", tag, hash);
}